

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppression::SharedDtor(NonMaximumSuppression *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = (this->confidenceinputfeaturename_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = (this->coordinatesinputfeaturename_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = (this->iouthresholdinputfeaturename_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = (this->confidencethresholdinputfeaturename_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = (this->confidenceoutputfeaturename_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = (this->coordinatesoutputfeaturename_).ptr_;
  if (psVar1 != (string *)0x0 &&
      psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  if (this->_oneof_case_[0] != 0) {
    if ((this->_oneof_case_[0] == 1) &&
       ((this->SuppressionMethod_).picktop_ != (NonMaximumSuppression_PickTop *)0x0)) {
      (*(((this->SuppressionMethod_).picktop_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->_oneof_case_[0] = 0;
  }
  if (this->_oneof_case_[1] != 0) {
    clear_ClassLabels(this);
    return;
  }
  return;
}

Assistant:

void NonMaximumSuppression::SharedDtor() {
  confidenceinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  coordinatesinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  iouthresholdinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  confidencethresholdinputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  confidenceoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  coordinatesoutputfeaturename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_SuppressionMethod()) {
    clear_SuppressionMethod();
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
}